

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O2

void __thiscall minibag::Bag::swap(Bag *this,Bag *other)

{
  bool bVar1;
  BagMode BVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  Buffer *pBVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  CompressionType CVar8;
  int iVar9;
  CompressionType CVar10;
  
  BVar2 = this->mode_;
  this->mode_ = other->mode_;
  other->mode_ = BVar2;
  ChunkedFile::swap(&this->file_,&other->file_);
  CVar8 = other->compression_;
  iVar9 = this->version_;
  CVar10 = this->compression_;
  this->version_ = other->version_;
  this->compression_ = CVar8;
  other->version_ = iVar9;
  other->compression_ = CVar10;
  uVar3 = this->chunk_threshold_;
  this->chunk_threshold_ = other->chunk_threshold_;
  other->chunk_threshold_ = uVar3;
  uVar3 = this->bag_revision_;
  this->bag_revision_ = other->bag_revision_;
  other->bag_revision_ = uVar3;
  uVar4 = this->file_size_;
  this->file_size_ = other->file_size_;
  other->file_size_ = uVar4;
  uVar4 = this->file_header_pos_;
  this->file_header_pos_ = other->file_header_pos_;
  other->file_header_pos_ = uVar4;
  uVar4 = this->index_data_pos_;
  this->index_data_pos_ = other->index_data_pos_;
  other->index_data_pos_ = uVar4;
  uVar3 = this->connection_count_;
  this->connection_count_ = other->connection_count_;
  other->connection_count_ = uVar3;
  uVar3 = this->chunk_count_;
  this->chunk_count_ = other->chunk_count_;
  other->chunk_count_ = uVar3;
  bVar1 = this->chunk_open_;
  this->chunk_open_ = other->chunk_open_;
  other->chunk_open_ = bVar1;
  std::swap<minibag::ChunkInfo>(&this->curr_chunk_info_,&other->curr_chunk_info_);
  uVar4 = this->curr_chunk_data_pos_;
  this->curr_chunk_data_pos_ = other->curr_chunk_data_pos_;
  other->curr_chunk_data_pos_ = uVar4;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::swap(&(this->topic_connection_ids_)._M_t,&(other->topic_connection_ids_)._M_t);
  std::_Rb_tree<$6cc845ac$>::swap
            (&(this->header_connection_ids_)._M_t,&(other->header_connection_ids_)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>,_std::_Select1st<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_minibag::ConnectionInfo_*>_>_>
  ::swap(&(this->connections_)._M_t,&(other->connections_)._M_t);
  std::_Vector_base<minibag::ChunkInfo,_std::allocator<minibag::ChunkInfo>_>::_Vector_impl_data::
  _M_swap_data((_Vector_impl_data *)&this->chunks_,(_Vector_impl_data *)&other->chunks_);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
  ::swap(&(this->connection_indexes_)._M_t,&(other->connection_indexes_)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::multiset<minibag::IndexEntry,_std::less<minibag::IndexEntry>,_std::allocator<minibag::IndexEntry>_>_>_>_>
  ::swap(&(this->curr_chunk_connection_indexes_)._M_t,&(other->curr_chunk_connection_indexes_)._M_t)
  ;
  Buffer::swap(&this->header_buffer_,&other->header_buffer_);
  Buffer::swap(&this->record_buffer_,&other->record_buffer_);
  Buffer::swap(&this->chunk_buffer_,&other->chunk_buffer_);
  Buffer::swap(&this->decompress_buffer_,&other->decompress_buffer_);
  Buffer::swap(&this->outgoing_chunk_buffer_,&other->outgoing_chunk_buffer_);
  pBVar5 = this->current_buffer_;
  this->current_buffer_ = other->current_buffer_;
  other->current_buffer_ = pBVar5;
  uVar4 = this->decompressed_chunk_;
  this->decompressed_chunk_ = other->decompressed_chunk_;
  other->decompressed_chunk_ = uVar4;
  peVar6 = (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (other->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar6;
  p_Var7 = (other->encryptor_).
           super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (other->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (this->encryptor_).super___shared_ptr<minibag::EncryptorBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var7;
  return;
}

Assistant:

void Bag::swap(Bag& other) {
    using std::swap;
    swap(mode_, other.mode_);
    swap(file_, other.file_);
    swap(version_, other.version_);
    swap(compression_, other.compression_);
    swap(chunk_threshold_, other.chunk_threshold_);
    swap(bag_revision_, other.bag_revision_);
    swap(file_size_, other.file_size_);
    swap(file_header_pos_, other.file_header_pos_);
    swap(index_data_pos_, other.index_data_pos_);
    swap(connection_count_, other.connection_count_);
    swap(chunk_count_, other.chunk_count_);
    swap(chunk_open_, other.chunk_open_);
    swap(curr_chunk_info_, other.curr_chunk_info_);
    swap(curr_chunk_data_pos_, other.curr_chunk_data_pos_);
    swap(topic_connection_ids_, other.topic_connection_ids_);
    swap(header_connection_ids_, other.header_connection_ids_);
    swap(connections_, other.connections_);
    swap(chunks_, other.chunks_);
    swap(connection_indexes_, other.connection_indexes_);
    swap(curr_chunk_connection_indexes_, other.curr_chunk_connection_indexes_);
    swap(header_buffer_, other.header_buffer_);
    swap(record_buffer_, other.record_buffer_);
    swap(chunk_buffer_, other.chunk_buffer_);
    swap(decompress_buffer_, other.decompress_buffer_);
    swap(outgoing_chunk_buffer_, other.outgoing_chunk_buffer_);
    swap(current_buffer_, other.current_buffer_);
    swap(decompressed_chunk_, other.decompressed_chunk_);
    swap(encryptor_, other.encryptor_);
}